

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

string * __thiscall
soul::AST::Connection::getDefaultEndpointName_abi_cxx11_
          (string *__return_storage_ptr__,Connection *this,Context *errorContext,ProcessorBase *p,
          bool wantInput)

{
  bool bVar1;
  EndpointDeclaration *pEVar2;
  string *psVar3;
  CompileMessage local_e8;
  pool_ptr<soul::AST::EndpointDeclaration> local_b0;
  CompileMessage local_a8;
  pool_ref<soul::AST::EndpointDeclaration> *local_70;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  pool_ref<soul::AST::EndpointDeclaration> *__end2;
  pool_ref<soul::AST::EndpointDeclaration> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> local_48;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *local_38;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *__range2;
  pool_ptr<soul::AST::EndpointDeclaration> found;
  bool wantInput_local;
  ProcessorBase *p_local;
  Context *errorContext_local;
  
  found.object._7_1_ = (byte)p & 1;
  pool_ptr<soul::AST::EndpointDeclaration>::pool_ptr
            ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range2);
  local_48 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>)
             (**(code **)((long)&(((errorContext->location).sourceCode.object)->content).field_2 + 8
                         ))();
  local_38 = &local_48;
  __end2 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::begin(local_38);
  e = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::end(local_38);
  do {
    if (__end2 == e) {
      bVar1 = pool_ptr<soul::AST::EndpointDeclaration>::operator==
                        ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range2,(void *)0x0);
      if (!bVar1) {
        pEVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                           ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range2);
        psVar3 = Identifier::toString_abi_cxx11_(&pEVar2->name);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
        pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr
                  ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range2);
        return __return_storage_ptr__;
      }
      if ((found.object._7_1_ & 1) == 0) {
        Errors::processorHasNoSuitableOutputs<>();
      }
      else {
        Errors::processorHasNoSuitableInputs<>();
      }
      Context::throwError((Context *)this,&local_e8,false);
    }
    local_70 = __end2;
    pEVar2 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end2);
    if ((pEVar2->isConsoleEndpoint & 1U) == 0) {
      pEVar2 = pool_ref<soul::AST::EndpointDeclaration>::operator->(local_70);
      if ((pEVar2->isInput & 1U) == (found.object._7_1_ & 1)) {
        bVar1 = pool_ptr<soul::AST::EndpointDeclaration>::operator!=
                          ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range2,(void *)0x0);
        if (bVar1) {
          Errors::mustBeOnlyOneEndpoint<>();
          Context::throwError((Context *)this,&local_a8,false);
        }
        pool_ref::operator_cast_to_pool_ptr((pool_ref *)&local_b0);
        __range2 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)local_b0.object;
        pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_b0);
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

static std::string getDefaultEndpointName (const Context& errorContext, ProcessorBase& p, bool wantInput)
        {
            pool_ptr<EndpointDeclaration> found;

            for (auto& e : p.getEndpoints())
            {
                if (!e->isConsoleEndpoint && e->isInput == wantInput)
                {
                    if (found != nullptr)
                        errorContext.throwError (Errors::mustBeOnlyOneEndpoint());

                    found = e;
                }
            }

            if (found == nullptr)
                errorContext.throwError (wantInput ? Errors::processorHasNoSuitableInputs()
                                                   : Errors::processorHasNoSuitableOutputs());

            return found->name.toString();
        }